

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall
pbrt::FormattingScene::ConcatTransform(FormattingScene *this,Float *transform,FileLoc loc)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct
            ((ulong)&local_38,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
  Printf<std::__cxx11::string>("%sConcatTransform [ ",&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  lVar1 = 0;
  do {
    Printf<float&>("%f ",(float *)((long)transform + lVar1));
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x40);
  Printf<>(" ]\n");
  return;
}

Assistant:

void FormattingScene::ConcatTransform(Float transform[16], FileLoc loc) {
    Printf("%sConcatTransform [ ", indent());
    for (int i = 0; i < 16; ++i)
        Printf("%f ", transform[i]);
    Printf(" ]\n");
}